

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::EntryDefineProperty(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  RecyclableObject *pRVar2;
  bool bVar3;
  int iVar4;
  CallFlags e;
  BOOL BVar5;
  TypeId TVar6;
  PropertyId PVar7;
  ScriptContext *pSVar8;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar9;
  Var pvVar10;
  JavascriptLibrary *pJVar11;
  PropertyRecord *pPVar12;
  char16 *pcVar13;
  RecyclableObject *local_e0;
  PropertyRecord *local_d8;
  undefined1 local_b0 [4];
  BOOL success;
  PropertyDescriptor propertyDescriptor;
  Var descVar;
  PropertyRecord *propertyRecord;
  Var propertyKey;
  RecyclableObject *local_58;
  RecyclableObject *obj;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar8 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar8);
  pSVar8 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar8,(PVOID)0x0);
  iVar4 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar4);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x520,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  obj = (RecyclableObject *)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x523,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (1 < ((uint)scriptContext & 0xffffff)) {
    pvVar10 = Arguments::operator[]((Arguments *)&scriptContext,1);
    BVar5 = Js::JavascriptOperators::IsObject(pvVar10);
    if (BVar5 != 0) {
      pvVar10 = Arguments::operator[]((Arguments *)&scriptContext,1);
      JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pvVar10);
      pvVar10 = Arguments::operator[]((Arguments *)&scriptContext,1);
      local_58 = VarTo<Js::RecyclableObject>(pvVar10);
      TVar6 = RecyclableObject::GetTypeId(local_58);
      pRVar2 = local_58;
      if (TVar6 == TypeIds_HostDispatch) {
        Arguments::Arguments((Arguments *)&propertyKey,(Arguments *)&scriptContext);
        iVar4 = (*(pRVar2->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])(pRVar2,EntryDefineProperty,&propertyKey,0);
        if (iVar4 != 0) {
          return local_58;
        }
      }
      if (((uint)scriptContext & 0xffffff) < 3) {
        pJVar11 = RecyclableObject::GetLibrary(local_58);
        local_d8 = (PropertyRecord *)
                   JavascriptLibraryBase::GetUndefined(&pJVar11->super_JavascriptLibraryBase);
      }
      else {
        local_d8 = (PropertyRecord *)Arguments::operator[]((Arguments *)&scriptContext,2);
      }
      propertyRecord = local_d8;
      JavascriptConversion::ToPropertyKey
                (local_d8,(ScriptContext *)obj,(PropertyRecord **)&descVar,(PropertyString **)0x0);
      if (((uint)scriptContext & 0xffffff) < 4) {
        pJVar11 = RecyclableObject::GetLibrary(local_58);
        local_e0 = JavascriptLibraryBase::GetUndefined(&pJVar11->super_JavascriptLibraryBase);
      }
      else {
        local_e0 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,3);
      }
      propertyDescriptor._40_8_ = local_e0;
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_b0);
      BVar5 = Js::JavascriptOperators::ToPropertyDescriptor
                        ((Var)propertyDescriptor._40_8_,(PropertyDescriptor *)local_b0,
                         (ScriptContext *)obj);
      pRVar2 = obj;
      if (BVar5 != 0) {
        if ((DAT_01ec73cb & 1) != 0) {
          ModifyGetterSetterFuncName
                    ((PropertyRecord *)descVar,(PropertyDescriptor *)local_b0,(ScriptContext *)obj);
        }
        pRVar2 = local_58;
        PVar7 = PropertyRecord::GetPropertyId((PropertyRecord *)descVar);
        BVar5 = DefineOwnPropertyHelper
                          (pRVar2,PVar7,(PropertyDescriptor *)local_b0,(ScriptContext *)obj,true);
        pRVar2 = obj;
        if (BVar5 != 0) {
          return local_58;
        }
        PVar7 = PropertyRecord::GetPropertyId((PropertyRecord *)descVar);
        pPVar12 = ScriptContext::GetPropertyName((ScriptContext *)pRVar2,PVar7);
        pcVar13 = PropertyRecord::GetBuffer(pPVar12);
        JavascriptError::ThrowTypeError((ScriptContext *)pRVar2,-0x7ff5ec27,pcVar13);
      }
      PVar7 = PropertyRecord::GetPropertyId((PropertyRecord *)descVar);
      pPVar12 = ScriptContext::GetPropertyName((ScriptContext *)pRVar2,PVar7);
      pcVar13 = PropertyRecord::GetBuffer(pPVar12);
      JavascriptError::ThrowTypeError((ScriptContext *)pRVar2,-0x7ff5ec2c,pcVar13);
    }
  }
  JavascriptError::ThrowTypeError((ScriptContext *)obj,-0x7ff5ec36,L"Object.defineProperty");
}

Assistant:

Var JavascriptObject::EntryDefineProperty(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Object.defineProperty"));
    }

#if ENABLE_COPYONACCESS_ARRAY
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(args[1]);
#endif
    RecyclableObject* obj = VarTo<RecyclableObject>(args[1]);

    // If the object is HostDispatch try to invoke the operation remotely
    if (obj->GetTypeId() == TypeIds_HostDispatch)
    {
        if (obj->InvokeBuiltInOperationRemotely(EntryDefineProperty, args, NULL))
        {
            return obj;
        }
    }

    Var propertyKey = args.Info.Count > 2 ? args[2] : obj->GetLibrary()->GetUndefined();
    PropertyRecord const * propertyRecord;
    JavascriptConversion::ToPropertyKey(propertyKey, scriptContext, &propertyRecord, nullptr);

    Var descVar = args.Info.Count > 3 ? args[3] : obj->GetLibrary()->GetUndefined();
    PropertyDescriptor propertyDescriptor;
    if (!JavascriptOperators::ToPropertyDescriptor(descVar, &propertyDescriptor, scriptContext))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propertyRecord->GetPropertyId())->GetBuffer());
    }

    if (CONFIG_FLAG(UseFullName))
    {
        ModifyGetterSetterFuncName(propertyRecord, propertyDescriptor, scriptContext);
    }

    BOOL success = DefineOwnPropertyHelper(obj, propertyRecord->GetPropertyId(), propertyDescriptor, scriptContext);
    if (!success)
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_DefineProperty_Default, scriptContext->GetPropertyName(propertyRecord->GetPropertyId())->GetBuffer());
    }

    return obj;
}